

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int mbedtls_gcm_starts(mbedtls_gcm_context *ctx,int mode,uchar *iv,size_t iv_len,uchar *add,
                      size_t add_len)

{
  uchar *local_88;
  uchar *local_80;
  size_t local_78;
  size_t olen;
  size_t use_len;
  uchar *p;
  size_t i;
  uchar work_buf [16];
  uchar *puStack_40;
  int ret;
  size_t add_len_local;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  int mode_local;
  mbedtls_gcm_context *ctx_local;
  
  work_buf[0xc] = 0x92;
  work_buf[0xd] = 0xff;
  work_buf[0xe] = 0xff;
  work_buf[0xf] = 0xff;
  local_78 = 0;
  if (((iv_len == 0) || (iv_len >> 0x3d != 0)) || (add_len >> 0x3d != 0)) {
    ctx_local._4_4_ = -0x14;
  }
  else {
    memset(ctx->y,0,0x10);
    memset(ctx->buf,0,0x10);
    ctx->mode = mode;
    ctx->len = 0;
    ctx->add_len = 0;
    if (iv_len == 0xc) {
      memcpy(ctx->y,iv,0xc);
      ctx->y[0xf] = '\x01';
    }
    else {
      memset(&i,0,0x10);
      work_buf[4] = (uchar)((iv_len << 3) >> 0x18);
      work_buf[5] = (uchar)((iv_len << 3) >> 0x10);
      work_buf[6] = (uchar)((iv_len << 3) >> 8);
      work_buf[7] = (uchar)(iv_len << 3);
      use_len = (size_t)iv;
      for (add_local = (uchar *)iv_len; add_local != (uchar *)0x0; add_local = add_local + -olen) {
        if (add_local < (uchar *)0x10) {
          local_80 = add_local;
        }
        else {
          local_80 = (uchar *)0x10;
        }
        olen = (size_t)local_80;
        for (p = (uchar *)0x0; p < local_80; p = p + 1) {
          ctx->y[(long)p] = ctx->y[(long)p] ^ p[use_len];
        }
        gcm_mult(ctx,ctx->y,ctx->y);
        use_len = olen + use_len;
      }
      for (p = (uchar *)0x0; p < (uchar *)0x10; p = p + 1) {
        ctx->y[(long)p] = ctx->y[(long)p] ^ *(byte *)((long)&i + (long)p);
      }
      gcm_mult(ctx,ctx->y,ctx->y);
    }
    ctx_local._4_4_ = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->y,0x10,ctx->base_ectr,&local_78);
    if (ctx_local._4_4_ == 0) {
      ctx->add_len = add_len;
      work_buf[0xc] = '\0';
      work_buf[0xd] = '\0';
      work_buf[0xe] = '\0';
      work_buf[0xf] = '\0';
      use_len = (size_t)add;
      for (puStack_40 = (uchar *)add_len; puStack_40 != (uchar *)0x0;
          puStack_40 = puStack_40 + -olen) {
        if (puStack_40 < (uchar *)0x10) {
          local_88 = puStack_40;
        }
        else {
          local_88 = (uchar *)0x10;
        }
        olen = (size_t)local_88;
        for (p = (uchar *)0x0; p < local_88; p = p + 1) {
          ctx->buf[(long)p] = ctx->buf[(long)p] ^ p[use_len];
        }
        gcm_mult(ctx,ctx->buf,ctx->buf);
        use_len = olen + use_len;
      }
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_gcm_starts( mbedtls_gcm_context *ctx,
                int mode,
                const unsigned char *iv,
                size_t iv_len,
                const unsigned char *add,
                size_t add_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char work_buf[16];
    size_t i;
    const unsigned char *p;
    size_t use_len, olen = 0;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( iv != NULL );
    GCM_VALIDATE_RET( add_len == 0 || add != NULL );

    /* IV and AD are limited to 2^64 bits, so 2^61 bytes */
    /* IV is not allowed to be zero length */
    if( iv_len == 0 ||
      ( (uint64_t) iv_len  ) >> 61 != 0 ||
      ( (uint64_t) add_len ) >> 61 != 0 )
    {
        return( MBEDTLS_ERR_GCM_BAD_INPUT );
    }

    memset( ctx->y, 0x00, sizeof(ctx->y) );
    memset( ctx->buf, 0x00, sizeof(ctx->buf) );

    ctx->mode = mode;
    ctx->len = 0;
    ctx->add_len = 0;

    if( iv_len == 12 )
    {
        memcpy( ctx->y, iv, iv_len );
        ctx->y[15] = 1;
    }
    else
    {
        memset( work_buf, 0x00, 16 );
        PUT_UINT32_BE( iv_len * 8, work_buf, 12 );

        p = iv;
        while( iv_len > 0 )
        {
            use_len = ( iv_len < 16 ) ? iv_len : 16;

            for( i = 0; i < use_len; i++ )
                ctx->y[i] ^= p[i];

            gcm_mult( ctx, ctx->y, ctx->y );

            iv_len -= use_len;
            p += use_len;
        }

        for( i = 0; i < 16; i++ )
            ctx->y[i] ^= work_buf[i];

        gcm_mult( ctx, ctx->y, ctx->y );
    }

    if( ( ret = mbedtls_cipher_update( &ctx->cipher_ctx, ctx->y, 16,
                                       ctx->base_ectr, &olen ) ) != 0 )
    {
        return( ret );
    }

    ctx->add_len = add_len;
    p = add;
    while( add_len > 0 )
    {
        use_len = ( add_len < 16 ) ? add_len : 16;

        for( i = 0; i < use_len; i++ )
            ctx->buf[i] ^= p[i];

        gcm_mult( ctx, ctx->buf, ctx->buf );

        add_len -= use_len;
        p += use_len;
    }

    return( 0 );
}